

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_cvc.c
# Opt level: O0

err_t cmdCVCsCount(size_t *count,octet *certs,size_t certs_len)

{
  long in_RDX;
  long *in_RDI;
  size_t len;
  octet *in_stack_ffffffffffffffd8;
  long local_20;
  
  *in_RDI = 0;
  local_20 = in_RDX;
  while( true ) {
    if (local_20 == 0) {
      return 0;
    }
    in_stack_ffffffffffffffd8 = (octet *)btokCVCLen(in_stack_ffffffffffffffd8,0x104606);
    if (in_stack_ffffffffffffffd8 == (octet *)0xffffffffffffffff) break;
    local_20 = local_20 - (long)in_stack_ffffffffffffffd8;
    *in_RDI = *in_RDI + 1;
  }
  return 0x204;
}

Assistant:

err_t cmdCVCsCount(size_t* count, const octet* certs, size_t certs_len)
{
	ASSERT(memIsValid(certs, certs_len));
	ASSERT(memIsValid(count, O_PER_S));
	// цикл по сертификатам
	for (*count = 0; certs_len; ++*count)
	{
		size_t len = btokCVCLen(certs, certs_len);
		if (len == SIZE_MAX)
			return ERR_BAD_CERTRING;
		certs += len, certs_len -= len;
	}
	return ERR_OK;
}